

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O3

Maybe<kj::Url> *
kj::Url::tryParse(Maybe<kj::Url> *__return_storage_ptr__,StringPtr text,Context context,
                 Options options)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined8 uVar3;
  unsigned_long i;
  anon_unknown_0 *paVar4;
  anon_unknown_0 *paVar5;
  byte *pbVar6;
  anon_unknown_0 *paVar7;
  byte *pbVar8;
  anon_unknown_0 *paVar9;
  Maybe<kj::Url> *pMVar10;
  undefined8 *puVar11;
  size_t sVar12;
  byte *pbVar13;
  undefined6 in_register_00000082;
  bool *hadErrors;
  Options *in_R9;
  anon_unknown_0 *paVar14;
  unsigned_long i_3;
  anon_unknown_0 *paVar15;
  anon_unknown_0 *paVar16;
  ulong size;
  bool bVar17;
  ArrayPtr<const_char> text_00;
  ArrayPtr<const_char> text_01;
  ArrayPtr<const_char> text_02;
  ArrayPtr<const_char> text_03;
  ArrayPtr<const_char> text_04;
  ArrayPtr<const_char> text_05;
  ArrayPtr<const_char> text_06;
  ArrayPtr<const_char> text_07;
  ArrayPtr<const_char> text_08;
  bool err;
  String result;
  Fault f;
  char local_1a5;
  uint local_1a4;
  undefined8 local_1a0;
  undefined1 local_198 [24];
  undefined1 auStack_180 [40];
  anon_unknown_0 *local_158;
  Context local_14c;
  undefined8 local_148;
  Options *local_140;
  String local_138;
  Maybe<kj::Url> *local_120;
  Url local_118;
  
  paVar16 = (anon_unknown_0 *)text.content.size_;
  paVar7 = (anon_unknown_0 *)text.content.ptr;
  local_118.scheme.content.disposer._0_1_ = 0;
  local_118.scheme.content.disposer._1_7_ = 0;
  local_118.userInfo.ptr.isSet = false;
  local_118.scheme.content.ptr = (char *)0x0;
  local_118.scheme.content.size_._0_1_ = 0;
  local_118.scheme.content.size_._1_7_ = 0;
  local_118.host.content.ptr = (char *)0x0;
  local_118.host.content.size_ = 0;
  local_118.host.content.disposer = (ArrayDisposer *)0x0;
  local_118.path.builder.ptr = (String *)0x0;
  local_118.path.builder.pos = (String *)0x0;
  local_118.path.builder.endPtr = (String *)0x0;
  local_118.path.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_118.hasTrailingSlash = false;
  local_118.query.builder.ptr = (QueryParam *)0x0;
  local_118.query.builder.pos = (QueryParam *)0x0;
  local_118.query.builder.endPtr = (QueryParam *)0x0;
  local_118.query.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_118.fragment.ptr.isSet = false;
  local_1a4 = (uint)CONCAT62(in_register_00000082,options);
  local_1a5 = '\0';
  local_14c = context;
  local_120 = __return_storage_ptr__;
  local_118.options = options;
  if (context != REMOTE_HREF) {
    if (context == HTTP_PROXY_REQUEST) {
      puVar11 = &(anonymous_namespace)::getEndPathPart(kj::Url::Context)::END_PATH_PART_REQUEST;
      local_140 = (Options *)
                  &(anonymous_namespace)::getEndQueryPart(kj::Url::Context)::END_QUERY_PART_REQUEST;
      goto LAB_0044ec30;
    }
    if (context != HTTP_REQUEST) {
      kj::_::unreachable();
    }
    if ((paVar16 == (anon_unknown_0 *)0x1) || (*paVar7 != (anon_unknown_0)0x2f)) goto LAB_0044f321;
    local_140 = (Options *)
                &(anonymous_namespace)::getEndQueryPart(kj::Url::Context)::END_QUERY_PART_REQUEST;
    puVar11 = &(anonymous_namespace)::getEndPathPart(kj::Url::Context)::END_PATH_PART_REQUEST;
    paVar14 = paVar7;
    goto LAB_0044ea7d;
  }
  puVar11 = &(anonymous_namespace)::getEndPathPart(kj::Url::Context)::END_PATH_PART_HREF;
  local_140 = (Options *)
              &(anonymous_namespace)::getEndQueryPart(kj::Url::Context)::END_QUERY_PART_HREF;
LAB_0044ec30:
  paVar9 = (anon_unknown_0 *)memchr(paVar7,0x3a,(size_t)(paVar16 + -1));
  if (paVar9 != (anon_unknown_0 *)0x0) {
    size = (long)paVar9 - (long)paVar7;
    heapString((String *)local_198,size);
    if (paVar9 != paVar7) {
      pbVar8 = (byte *)local_198._8_8_;
      if ((byte *)local_198._8_8_ != (byte *)0x0) {
        pbVar8 = (byte *)local_198._0_8_;
      }
      memcpy(pbVar8,paVar7,size);
    }
    pcVar2 = local_118.scheme.content.ptr;
    if ((byte *)local_118.scheme.content.ptr != (byte *)0x0) {
      uVar1 = CONCAT71(local_118.scheme.content.size_._1_7_,
                       (undefined1)local_118.scheme.content.size_);
      local_118.scheme.content.ptr = (char *)0x0;
      local_118.scheme.content.size_._0_1_ = 0;
      local_118.scheme.content.size_._1_7_ = 0;
      in_R9 = (Options *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT71(local_118.scheme.content.disposer._1_7_,
                           local_118.scheme.content.disposer._0_1_))
                ((undefined8 *)
                 CONCAT71(local_118.scheme.content.disposer._1_7_,
                          local_118.scheme.content.disposer._0_1_),pcVar2,1,uVar1,uVar1);
    }
    local_118.scheme.content.ptr = (char *)local_198._0_8_;
    local_118.scheme.content.size_._0_1_ = (undefined1)local_198._8_8_;
    local_118.scheme.content.size_._1_7_ = SUB87(local_198._8_8_,1);
    pbVar8 = (byte *)(local_198._0_8_ + -1) + local_198._8_8_;
    pbVar6 = (byte *)local_198._0_8_;
    if ((byte *)local_198._8_8_ == (byte *)0x0) {
      pbVar6 = (byte *)0x0;
    }
    local_118.scheme.content.disposer._0_1_ = (undefined1)local_198._16_8_;
    local_118.scheme.content.disposer._1_7_ = SUB87(local_198._16_8_,1);
    if ((byte *)local_198._8_8_ == (byte *)0x0) {
      pbVar8 = (byte *)0x0;
    }
    for (; pbVar6 != pbVar8; pbVar6 = pbVar6 + 1) {
      if ((byte)(*pbVar6 + 0xbf) < 0x1a) {
        *pbVar6 = *pbVar6 | 0x20;
      }
    }
    if (((byte *)0x1 < (ulong)local_198._8_8_) &&
       ((*(ulong *)((anonymous_namespace)::ALPHAS + (ulong)(*(byte *)local_198._0_8_ >> 6) * 8) >>
         ((ulong)*(byte *)local_198._0_8_ & 0x3f) & 1) != 0)) {
      if ((byte *)local_198._8_8_ != (byte *)0x2) {
        pbVar8 = (byte *)0x0;
        do {
          if ((*(ulong *)((anonymous_namespace)::SCHEME_CHARS +
                         (ulong)(((byte *)(local_198._0_8_ + 1))[(long)pbVar8] >> 6) * 8) >>
               ((ulong)((byte *)(local_198._0_8_ + 1))[(long)pbVar8] & 0x3f) & 1) == 0)
          goto LAB_0044f321;
          pbVar8 = pbVar8 + 1;
        } while ((byte *)(local_198._8_8_ + -2) != pbVar8);
      }
      if (((anon_unknown_0 *)0x1 < paVar16 + (~size - 1)) && (*(short *)(paVar9 + 1) == 0x2f2f)) {
        paVar15 = paVar9 + 3;
        paVar4 = paVar16 + (~size - 3);
        if (paVar4 == (anon_unknown_0 *)0x0) {
          paVar5 = (anon_unknown_0 *)0x0;
          paVar16 = (anon_unknown_0 *)0x1;
          paVar14 = (anon_unknown_0 *)0x524569;
        }
        else {
          paVar5 = (anon_unknown_0 *)0x0;
          paVar14 = (anon_unknown_0 *)0x524569;
          do {
            if (((ulong)(&(anonymous_namespace)::getEndPathPart(kj::Url::Context)::
                          END_PATH_PART_HREF)[(byte)paVar15[(long)paVar5] >> 6] >>
                 ((ulong)(byte)paVar15[(long)paVar5] & 0x3f) & 1) != 0) {
              paVar14 = paVar15 + (long)paVar5;
              paVar16 = paVar7 + (long)(paVar16 + (-(long)paVar5 - (long)paVar9) + -3);
              if (paVar5 != (anon_unknown_0 *)0x0) goto LAB_0044f0e2;
              paVar5 = (anon_unknown_0 *)0x0;
              goto LAB_0044f228;
            }
            paVar5 = paVar5 + 1;
          } while (paVar7 + (long)(paVar16 + (-4 - (long)paVar9)) != paVar5);
          paVar16 = (anon_unknown_0 *)0x1;
          paVar5 = paVar4;
LAB_0044f0e2:
          paVar7 = (anon_unknown_0 *)0x1;
          do {
            if ((paVar9 + 2)[(long)paVar7] == (anon_unknown_0)0x40) {
              if (local_14c != REMOTE_HREF) goto LAB_0044f321;
              local_158 = paVar7 + (long)paVar9 + 3;
              paVar5 = paVar5 + -(long)paVar7;
              if (paVar7 == (anon_unknown_0 *)0x1) goto LAB_0044f141;
              paVar4 = (anon_unknown_0 *)0x0;
              goto LAB_0044f131;
            }
            bVar17 = paVar7 != paVar5;
            paVar7 = paVar7 + 1;
          } while (bVar17);
        }
        goto LAB_0044f228;
      }
    }
  }
  goto LAB_0044f321;
  while (paVar4 = paVar4 + 1, paVar7 + -1 != paVar4) {
LAB_0044f131:
    if ((paVar9 + 3)[(long)paVar4] == (anon_unknown_0)0x3a) {
      local_148 = (anon_unknown_0 *)(CONCAT44(local_148._4_4_,local_1a4) & 0xffffffff000000ff);
      text_06.size_ = (size_t)&local_1a5;
      text_06.ptr = (char *)paVar4;
      local_1a0 = paVar4;
      anon_unknown_0::percentDecode
                ((String *)local_198,paVar15,text_06,(bool *)(ulong)(byte)local_1a4,in_R9);
      text_07.size_ = (size_t)&local_1a5;
      text_07.ptr = (char *)(paVar7 + (-2 - (long)local_1a0));
      anon_unknown_0::percentDecode
                (&local_138,local_1a0 + (long)paVar9 + 4,text_07,
                 (bool *)((ulong)local_148 & 0xffffffff),in_R9);
      auStack_180[0] = 1;
      auStack_180._8_8_ = local_138.content.ptr;
      auStack_180._16_8_ = local_138.content.size_;
      auStack_180._24_8_ = local_138.content.disposer;
      local_138.content.ptr = (char *)0x0;
      local_138.content.size_ = 0;
      kj::_::NullableValue<kj::Url::UserInfo>::emplace<kj::Url::UserInfo>
                (&local_118.userInfo.ptr,(UserInfo *)local_198);
      UserInfo::~UserInfo((UserInfo *)local_198);
      String::~String(&local_138);
      paVar15 = local_158;
      goto LAB_0044f228;
    }
  }
LAB_0044f141:
  text_05.size_ = (size_t)&local_1a5;
  text_05.ptr = (char *)(paVar7 + -1);
  anon_unknown_0::percentDecode
            ((String *)local_198,paVar15,text_05,(bool *)(ulong)(byte)local_1a4,in_R9);
  auStack_180._0_8_ = auStack_180._0_8_ & 0xffffffffffffff00;
  kj::_::NullableValue<kj::Url::UserInfo>::emplace<kj::Url::UserInfo>
            (&local_118.userInfo.ptr,(UserInfo *)local_198);
  UserInfo::~UserInfo((UserInfo *)local_198);
  paVar15 = local_158;
LAB_0044f228:
  text_08.size_ = (size_t)&local_1a5;
  text_08.ptr = (char *)paVar5;
  anon_unknown_0::percentDecode
            ((String *)local_198,paVar15,text_08,(bool *)(ulong)(byte)local_1a4,in_R9);
  sVar12 = local_118.host.content.size_;
  pcVar2 = local_118.host.content.ptr;
  if ((byte *)local_118.host.content.ptr != (byte *)0x0) {
    local_118.host.content.ptr = (char *)0x0;
    local_118.host.content.size_ = 0;
    in_R9 = (Options *)0x0;
    (**(local_118.host.content.disposer)->_vptr_ArrayDisposer)
              (local_118.host.content.disposer,pcVar2,1,sVar12,sVar12);
  }
  local_118.host.content.ptr = (char *)local_198._0_8_;
  local_118.host.content.size_ = local_198._8_8_;
  local_118.host.content.disposer = (ArrayDisposer *)local_198._16_8_;
  local_198._0_8_ = (byte *)0x0;
  local_198._8_8_ = (byte *)0x0;
  String::~String((String *)local_198);
  pbVar8 = (byte *)local_118.host.content.ptr;
  if ((byte *)local_118.host.content.size_ == (byte *)0x0) {
    pbVar8 = (byte *)0x0;
  }
  pbVar6 = (byte *)0x0;
  if ((byte *)local_118.host.content.size_ != (byte *)0x0) {
    pbVar6 = (byte *)(local_118.host.content.size_ + -1);
  }
  if ((byte *)local_118.host.content.size_ != (byte *)0x0 &&
      (byte *)(local_118.host.content.size_ + -1) != (byte *)0x0) {
    pbVar13 = (byte *)0x0;
    do {
      in_R9 = (Options *)(ulong)pbVar8[(long)pbVar13];
      if ((*(ulong *)((anonymous_namespace)::HOST_CHARS + (ulong)(pbVar8[(long)pbVar13] >> 6) * 8)
           >> ((ulong)in_R9 & 0x3f) & 1) == 0) goto LAB_0044f321;
      pbVar13 = pbVar13 + 1;
    } while (pbVar6 != pbVar13);
  }
  pbVar6 = (byte *)(local_118.host.content.ptr + -1 + local_118.host.content.size_);
  if ((byte *)local_118.host.content.size_ == (byte *)0x0) {
    pbVar6 = (byte *)0x0;
  }
  for (; pbVar8 != pbVar6; pbVar8 = pbVar8 + 1) {
    if ((byte)(*pbVar8 + 0xbf) < 0x1a) {
      *pbVar8 = *pbVar8 | 0x20;
    }
  }
  if (paVar16 != (anon_unknown_0 *)0x1) {
LAB_0044ea7d:
    hadErrors = (bool *)(ulong)(byte)local_1a4;
    local_1a0 = (anon_unknown_0 *)(CONCAT44(local_1a0._4_4_,local_1a4) & 0xffffffff000000ff);
    do {
      if (*paVar14 != (anon_unknown_0)0x2f) {
        if (*paVar14 != (anon_unknown_0)0x3f) goto LAB_0044f01d;
        goto LAB_0044ee01;
      }
      bVar17 = true;
      paVar7 = paVar16 + -2;
      if (paVar7 == (anon_unknown_0 *)0x0) {
        paVar16 = (anon_unknown_0 *)0x1;
        paVar9 = (anon_unknown_0 *)0x524569;
      }
      else {
        paVar15 = paVar14 + 1;
        paVar4 = (anon_unknown_0 *)0x0;
        do {
          if (((ulong)puVar11[(byte)paVar15[(long)paVar4] >> 6] >>
               ((ulong)(byte)paVar15[(long)paVar4] & 0x3f) & 1) != 0) {
            paVar9 = paVar15 + (long)paVar4;
            paVar16 = paVar16 + ~(ulong)paVar4;
            goto LAB_0044eaf5;
          }
          paVar4 = paVar4 + 1;
        } while (paVar7 != paVar4);
        paVar16 = (anon_unknown_0 *)0x1;
        paVar9 = (anon_unknown_0 *)0x524569;
        paVar4 = paVar7;
LAB_0044eaf5:
        if (paVar4 == (anon_unknown_0 *)0x0) {
          if ((local_1a4 >> 8 & 1) != 0) {
            if (paVar16 != (anon_unknown_0 *)0x1) goto LAB_0044eb68;
            paVar16 = (anon_unknown_0 *)0x1;
          }
        }
        else if (paVar4 == (anon_unknown_0 *)0x1) {
          if (*paVar15 != (anon_unknown_0)0x2e) goto LAB_0044eb68;
        }
        else if (((paVar4 == (anon_unknown_0 *)0x2) && (*paVar15 == (anon_unknown_0)0x2e)) &&
                (paVar14[2] == (anon_unknown_0)0x2e)) {
          if (local_118.path.builder.pos != local_118.path.builder.ptr) {
            ArrayBuilder<kj::String>::removeLast(&local_118.path.builder);
            hadErrors = (bool *)((ulong)local_1a0 & 0xffffffff);
          }
        }
        else {
LAB_0044eb68:
          text_00.size_ = (size_t)&local_1a5;
          text_00.ptr = (char *)paVar4;
          anon_unknown_0::percentDecode((String *)local_198,paVar15,text_00,hadErrors,in_R9);
          if (local_118.path.builder.pos == local_118.path.builder.endPtr) {
            sVar12 = ((long)local_118.path.builder.pos - (long)local_118.path.builder.ptr >> 3) *
                     0x5555555555555556;
            if (local_118.path.builder.pos == local_118.path.builder.ptr) {
              sVar12 = 4;
            }
            Vector<kj::String>::setCapacity(&local_118.path,sVar12);
          }
          hadErrors = (bool *)((ulong)local_1a0 & 0xffffffff);
          ((local_118.path.builder.pos)->content).ptr = (char *)local_198._0_8_;
          ((local_118.path.builder.pos)->content).size_ = local_198._8_8_;
          ((local_118.path.builder.pos)->content).disposer = (ArrayDisposer *)local_198._16_8_;
          local_118.path.builder.pos = local_118.path.builder.pos + 1;
          bVar17 = false;
        }
      }
      paVar14 = paVar9;
      local_118.hasTrailingSlash = bVar17;
    } while (paVar16 != (anon_unknown_0 *)0x1);
  }
LAB_0044f31a:
  pMVar10 = local_120;
  if (local_1a5 == '\0') {
    (local_120->ptr).isSet = true;
    Url(&(local_120->ptr).field_1.value,&local_118);
    goto LAB_0044f32c;
  }
  goto LAB_0044f321;
  while (paVar14 = local_158, *local_158 == (anon_unknown_0)0x26) {
LAB_0044ee01:
    paVar7 = paVar14 + 1;
    paVar9 = paVar16 + -2;
    if (paVar9 == (anon_unknown_0 *)0x0) {
      paVar16 = (anon_unknown_0 *)0x1;
      local_158 = (anon_unknown_0 *)0x524569;
LAB_0044eea1:
      if ((local_1a4 >> 8 & 1) != 0) {
        paVar15 = (anon_unknown_0 *)0x0;
        goto LAB_0044eeb0;
      }
    }
    else {
      paVar15 = (anon_unknown_0 *)0x0;
      do {
        in_R9 = local_140;
        if ((*(ulong *)(local_140 + (ulong)((byte)paVar7[(long)paVar15] >> 6) * 4) >>
             ((ulong)(byte)paVar7[(long)paVar15] & 0x3f) & 1) != 0) {
          local_158 = paVar7 + (long)paVar15;
          paVar16 = paVar16 + ~(ulong)paVar15;
          if (paVar15 == (anon_unknown_0 *)0x0) goto LAB_0044eea1;
          goto LAB_0044ee79;
        }
        paVar15 = paVar15 + 1;
      } while (paVar16 + -2 != paVar15);
      paVar16 = (anon_unknown_0 *)0x1;
      local_158 = (anon_unknown_0 *)0x524569;
      paVar15 = paVar9;
LAB_0044ee79:
      paVar9 = (anon_unknown_0 *)0x0;
      do {
        local_148 = paVar16;
        if ((paVar14 + 1)[(long)paVar9] == (anon_unknown_0)0x3d) {
          text_02.size_ = (size_t)&local_1a5;
          text_02.ptr = (char *)paVar9;
          anon_unknown_0::percentDecodeQuery((String *)local_198,paVar7,text_02,hadErrors,local_140)
          ;
          text_03.size_ = (size_t)&local_1a5;
          text_03.ptr = (char *)(paVar15 + ~(ulong)paVar9);
          anon_unknown_0::percentDecodeQuery
                    ((String *)auStack_180,paVar14 + (long)paVar9 + 2,text_03,hadErrors,in_R9);
          paVar16 = local_148;
          if (local_118.query.builder.pos == local_118.query.builder.endPtr) {
            sVar12 = ((long)local_118.query.builder.pos - (long)local_118.query.builder.ptr >> 4) *
                     0x5555555555555556;
            if (local_118.query.builder.pos == local_118.query.builder.ptr) {
              sVar12 = 4;
            }
            Vector<kj::Url::QueryParam>::setCapacity(&local_118.query,sVar12);
          }
          goto LAB_0044efb8;
        }
        paVar9 = paVar9 + 1;
      } while (paVar15 != paVar9);
LAB_0044eeb0:
      text_01.size_ = (size_t)&local_1a5;
      text_01.ptr = (char *)paVar15;
      anon_unknown_0::percentDecodeQuery((String *)local_198,paVar7,text_01,hadErrors,in_R9);
      auStack_180._0_8_ = (char *)0x0;
      auStack_180._8_8_ = (char *)0x0;
      auStack_180._16_8_ = (ArrayDisposer *)0x0;
      if (local_118.query.builder.pos == local_118.query.builder.endPtr) {
        sVar12 = ((long)local_118.query.builder.pos - (long)local_118.query.builder.ptr >> 4) *
                 0x5555555555555556;
        if (local_118.query.builder.pos == local_118.query.builder.ptr) {
          sVar12 = 4;
        }
        Vector<kj::Url::QueryParam>::setCapacity(&local_118.query,sVar12);
      }
LAB_0044efb8:
      hadErrors = (bool *)((ulong)local_1a0 & 0xffffffff);
      ((local_118.query.builder.pos)->name).content.ptr = (char *)local_198._0_8_;
      ((local_118.query.builder.pos)->name).content.size_ = local_198._8_8_;
      local_198._0_8_ = (byte *)0x0;
      local_198._8_8_ = (byte *)0x0;
      ((local_118.query.builder.pos)->name).content.disposer = (ArrayDisposer *)local_198._16_8_;
      ((local_118.query.builder.pos)->value).content.ptr = (char *)auStack_180._0_8_;
      ((local_118.query.builder.pos)->value).content.size_ = auStack_180._8_8_;
      ((local_118.query.builder.pos)->value).content.disposer = (ArrayDisposer *)auStack_180._16_8_;
      local_118.query.builder.pos = local_118.query.builder.pos + 1;
    }
    if (paVar16 == (anon_unknown_0 *)0x1) goto LAB_0044f31a;
  }
LAB_0044f01d:
  if (*paVar14 != (anon_unknown_0)0x23) {
    local_198._0_8_ = paVar16 + -1;
    local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
    local_198._16_8_ = " == ";
    auStack_180._0_8_ = &DAT_00000005;
    auStack_180._8_8_ = auStack_180._8_8_ & 0xffffffffffffff00;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
              ((Fault *)&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
               ,0x10e,FAILED,"text.size() == 0","_kjCondition,",
               (DebugComparison<unsigned_long,_int> *)local_198);
    kj::_::Debug::Fault::fatal((Fault *)&local_138);
  }
  if (local_14c == REMOTE_HREF) {
    text_04.size_ = (size_t)&local_1a5;
    text_04.ptr = (char *)(paVar16 + -2);
    anon_unknown_0::percentDecode((String *)local_198,paVar14 + 1,text_04,hadErrors,in_R9);
    uVar3 = local_118.fragment.ptr.field_1.value.content.size_;
    uVar1 = local_118.fragment.ptr.field_1.value.content.ptr;
    if ((local_118.fragment.ptr.isSet == true) &&
       (local_118.fragment.ptr.isSet = false,
       (byte *)local_118.fragment.ptr.field_1.value.content.ptr != (byte *)0x0)) {
      local_118.fragment.ptr.field_1.value.content.ptr = (char *)0x0;
      local_118.fragment.ptr.field_1.value.content.size_ = 0;
      (**(local_118.fragment.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                (local_118.fragment.ptr.field_1.value.content.disposer,uVar1,1,uVar3,uVar3,0);
    }
    local_118.fragment.ptr.field_1.value.content.ptr = (char *)local_198._0_8_;
    local_118.fragment.ptr.field_1.value.content.size_ = local_198._8_8_;
    local_118.fragment.ptr.field_1.value.content.disposer = (ArrayDisposer *)local_198._16_8_;
    local_118.fragment.ptr.isSet = true;
    goto LAB_0044f31a;
  }
LAB_0044f321:
  (local_120->ptr).isSet = false;
  pMVar10 = local_120;
LAB_0044f32c:
  ~Url(&local_118);
  return pMVar10;
}

Assistant:

Maybe<Url> Url::tryParse(StringPtr text, Context context, Options options) {
  Url result;
  result.options = options;
  bool err = false;  // tracks percent-decoding errors

  auto& END_PATH_PART = getEndPathPart(context);
  auto& END_QUERY_PART = getEndQueryPart(context);

  if (context == HTTP_REQUEST) {
    if (!text.startsWith("/")) {
      return kj::none;
    }
  } else {
    KJ_IF_SOME(scheme, trySplit(text, ':')) {
      result.scheme = kj::str(scheme);
    } else {
      // missing scheme
      return kj::none;
    }
    toLower(result.scheme);
    if (result.scheme.size() == 0 ||
        !ALPHAS.contains(result.scheme[0]) ||
        !SCHEME_CHARS.containsAll(result.scheme.slice(1))) {
      // bad scheme
      return kj::none;
    }

    if (!text.startsWith("//")) {
      // We require an authority (hostname) part.
      return kj::none;
    }
    text = text.slice(2);

    {
      auto authority = split(text, END_AUTHORITY);

      KJ_IF_SOME(userpass, trySplit(authority, '@')) {
        if (context != REMOTE_HREF) {
          // No user/pass allowed here.
          return kj::none;
        }
        KJ_IF_SOME(username, trySplit(userpass, ':')) {
          result.userInfo = UserInfo {
            percentDecode(username, err, options),
            percentDecode(userpass, err, options)
          };
        } else {
          result.userInfo = UserInfo {
            percentDecode(userpass, err, options),
            kj::none
          };
        }
      }

      result.host = percentDecode(authority, err, options);
      if (!HOST_CHARS.containsAll(result.host)) return kj::none;
      toLower(result.host);
    }